

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int CustomSetup(VP8Io *io)

{
  uint uVar1;
  rescaler_t *dst;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  rescaler_t *prVar10;
  code *pcVar11;
  void *pvVar12;
  WebPRescaler *pWVar13;
  long lVar14;
  long lVar15;
  WEBP_CSP_MODE src_colorspace;
  int iVar16;
  undefined8 *puVar17;
  size_t size;
  WebPRescaler *pWVar18;
  int dst_height;
  int src_width;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  puVar4 = (undefined8 *)io->opaque;
  uVar2 = *(uint *)*puVar4;
  if ((uVar2 < 0xd) && ((0x103aU >> (uVar2 & 0x1f) & 1) != 0)) {
    puVar4[0xc] = 0;
    puVar4[0xd] = 0;
    puVar4[10] = 0;
    puVar4[0xb] = 0;
    src_colorspace = MODE_YUV;
    bVar21 = false;
  }
  else {
    bVar21 = uVar2 - 0xb < 0xfffffffc;
    puVar4[0xc] = 0;
    puVar4[0xd] = 0;
    puVar4[10] = 0;
    puVar4[0xb] = 0;
    src_colorspace = bVar21 + MODE_YUV;
  }
  puVar17 = puVar4 + 10;
  iVar6 = WebPIoInitFromOptions((WebPDecoderOptions *)puVar4[5],io,src_colorspace);
  if (iVar6 == 0) {
    return 0;
  }
  if (0xfffffffb < uVar2 - 0xb && !bVar21) {
    WebPInitUpsamplers();
  }
  if (io->use_scaling == 0) {
    if (uVar2 < 0xb) {
      WebPInitSamplers();
      puVar4[0xb] = EmitSampledRGB;
      if (io->fancy_upsampling != 0) {
        uVar9 = (long)io->mb_w + 1;
        pvVar12 = WebPSafeMalloc(1,(uVar9 & 0xfffffffffffffffe) + (long)io->mb_w);
        *puVar17 = pvVar12;
        if (pvVar12 == (void *)0x0) {
          return 0;
        }
        puVar4[1] = pvVar12;
        lVar15 = (long)io->mb_w + (long)pvVar12;
        puVar4[2] = lVar15;
        puVar4[3] = ((int)uVar9 >> 1) + lVar15;
        puVar4[0xb] = EmitFancyRGB;
        WebPInitUpsamplers();
      }
    }
    else {
      puVar4[0xb] = EmitYUV;
    }
    if (bVar21) {
      return 1;
    }
    if ((uVar2 == 10) || (uVar2 == 5)) {
      pcVar11 = EmitAlphaRGBA4444;
LAB_00106571:
      puVar4[0xc] = pcVar11;
    }
    else {
      pcVar11 = EmitAlphaRGB;
      if (10 < uVar2) {
        pcVar11 = EmitAlphaYUV;
      }
      puVar4[0xc] = pcVar11;
      if (10 < uVar2) {
        return 1;
      }
    }
LAB_00106575:
    WebPInitAlphaProcessing();
    iVar6 = 1;
  }
  else {
    piVar5 = (int *)*puVar4;
    iVar6 = *piVar5;
    uVar1 = iVar6 - 1;
    if (uVar2 < 0xb) {
      if ((uVar1 < 0xc) && ((0x81dU >> (uVar1 & 0x1f) & 1) != 0)) {
        bVar21 = false;
      }
      else {
        bVar21 = iVar6 - 0xbU < 0xfffffffc;
      }
      iVar6 = io->scaled_width;
      lVar19 = (long)iVar6;
      iVar3 = io->scaled_height;
      iVar8 = io->mb_w;
      iVar16 = io->mb_h;
      lVar14 = 4 - (ulong)bVar21;
      lVar20 = lVar19 * 2 * lVar14;
      lVar15 = lVar14 * lVar19 + lVar20 * 4;
      prVar10 = (rescaler_t *)WebPSafeMalloc(1,lVar14 * 0x68 + lVar15 + 0x1f);
      *puVar17 = prVar10;
      if (prVar10 == (rescaler_t *)0x0) {
        return 0;
      }
      dst = prVar10 + lVar20;
      pWVar18 = (WebPRescaler *)((long)prVar10 + lVar15 + 0x1f & 0xffffffffffffffe0);
      puVar4[6] = pWVar18;
      puVar4[7] = pWVar18 + 1;
      pWVar13 = (WebPRescaler *)0x0;
      if (bVar21 == false) {
        pWVar13 = pWVar18 + 3;
      }
      puVar4[8] = pWVar18 + 2;
      puVar4[9] = pWVar13;
      iVar7 = WebPRescalerInit(pWVar18,io->mb_w,io->mb_h,(uint8_t *)dst,iVar6,iVar3,0,1,prVar10);
      if (iVar7 != 0) {
        iVar7 = iVar8 + 1 >> 1;
        iVar16 = iVar16 + 1 >> 1;
        iVar8 = WebPRescalerInit((WebPRescaler *)puVar4[7],iVar7,iVar16,
                                 (uint8_t *)((long)dst + lVar19),iVar6,iVar3,0,1,
                                 prVar10 + lVar19 * 2);
        if ((iVar8 != 0) &&
           (iVar8 = WebPRescalerInit((WebPRescaler *)puVar4[8],iVar7,iVar16,
                                     (uint8_t *)((long)dst + lVar19 * 2),iVar6,iVar3,0,1,
                                     prVar10 + lVar19 * 4), iVar8 != 0)) {
          puVar4[0xb] = EmitRescaledRGB;
          WebPInitYUV444Converters();
          if (bVar21 != false) {
            return 1;
          }
          iVar6 = WebPRescalerInit((WebPRescaler *)puVar4[9],io->mb_w,io->mb_h,
                                   (uint8_t *)((long)dst + (long)(iVar6 * 3)),iVar6,iVar3,0,1,
                                   prVar10 + lVar19 * 6);
          if (iVar6 == 0) {
            return 0;
          }
          puVar4[0xc] = EmitRescaledAlphaRGB;
          pcVar11 = ExportAlpha;
          if (*(int *)*puVar4 == 10) {
            pcVar11 = ExportAlphaRGBA4444;
          }
          if (*(int *)*puVar4 == 5) {
            pcVar11 = ExportAlphaRGBA4444;
          }
          puVar4[0xd] = pcVar11;
          goto LAB_00106575;
        }
      }
    }
    else {
      if ((uVar1 < 0xc) && ((0x81dU >> (uVar1 & 0x1f) & 1) != 0)) {
        bVar21 = false;
      }
      else {
        bVar21 = iVar6 - 0xbU < 0xfffffffc;
      }
      iVar6 = io->scaled_width;
      lVar19 = (long)iVar6;
      iVar3 = io->scaled_height;
      iVar8 = io->mb_w;
      iVar16 = io->mb_h;
      uVar9 = lVar19 + 1U & 0xfffffffffffffffe;
      lVar15 = lVar19 * 2 + uVar9 * 2;
      lVar14 = 0;
      if (!bVar21) {
        lVar14 = lVar19 * 8;
      }
      size = lVar14 + 0x1bf + lVar15 * 4;
      if (bVar21) {
        size = lVar14 + 0x157 + lVar15 * 4;
      }
      prVar10 = (rescaler_t *)WebPSafeMalloc(1,size);
      *puVar17 = prVar10;
      if (prVar10 == (rescaler_t *)0x0) {
        return 0;
      }
      pWVar18 = (WebPRescaler *)((long)prVar10 + lVar15 * 4 + lVar14 + 0x1f & 0xffffffffffffffe0);
      puVar4[6] = pWVar18;
      puVar4[7] = pWVar18 + 1;
      puVar4[8] = pWVar18 + 2;
      pWVar13 = (WebPRescaler *)0x0;
      if (!bVar21) {
        pWVar13 = pWVar18 + 3;
      }
      puVar4[9] = pWVar13;
      iVar7 = WebPRescalerInit(pWVar18,io->mb_w,io->mb_h,*(uint8_t **)(piVar5 + 4),iVar6,iVar3,
                               piVar5[0xc],1,prVar10);
      if (iVar7 != 0) {
        iVar7 = (int)(lVar19 + 1U) >> 1;
        dst_height = iVar3 + 1 >> 1;
        src_width = iVar8 + 1 >> 1;
        iVar16 = iVar16 + 1 >> 1;
        prVar10 = prVar10 + lVar19 * 2;
        iVar8 = WebPRescalerInit((WebPRescaler *)puVar4[7],src_width,iVar16,
                                 *(uint8_t **)(piVar5 + 6),iVar7,dst_height,piVar5[0xd],1,prVar10);
        if ((iVar8 != 0) &&
           (iVar8 = WebPRescalerInit((WebPRescaler *)puVar4[8],src_width,iVar16,
                                     *(uint8_t **)(piVar5 + 8),iVar7,dst_height,piVar5[0xe],1,
                                     prVar10 + uVar9), iVar8 != 0)) {
          puVar4[0xb] = EmitRescaledYUV;
          if (bVar21) {
            return 1;
          }
          iVar6 = WebPRescalerInit((WebPRescaler *)puVar4[9],io->mb_w,io->mb_h,
                                   *(uint8_t **)(piVar5 + 10),iVar6,iVar3,piVar5[0xf],1,
                                   prVar10 + uVar9 * 2);
          if (iVar6 == 0) {
            return 0;
          }
          pcVar11 = EmitRescaledAlphaYUV;
          goto LAB_00106571;
        }
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int CustomSetup(VP8Io* io) {
  WebPDecParams* const p = (WebPDecParams*)io->opaque;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int is_rgb = WebPIsRGBMode(colorspace);
  const int is_alpha = WebPIsAlphaMode(colorspace);

  p->memory = NULL;
  p->emit = NULL;
  p->emit_alpha = NULL;
  p->emit_alpha_row = NULL;
  if (!WebPIoInitFromOptions(p->options, io, is_alpha ? MODE_YUV : MODE_YUVA)) {
    return 0;
  }
  if (is_alpha && WebPIsPremultipliedMode(colorspace)) {
    WebPInitUpsamplers();
  }
  if (io->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
    const int ok = is_rgb ? InitRGBRescaler(io, p) : InitYUVRescaler(io, p);
    if (!ok) {
      return 0;    // memory error
    }
#else
    return 0;   // rescaling support not compiled
#endif
  } else {
    if (is_rgb) {
      WebPInitSamplers();
      p->emit = EmitSampledRGB;   // default
      if (io->fancy_upsampling) {
#ifdef FANCY_UPSAMPLING
        const int uv_width = (io->mb_w + 1) >> 1;
        p->memory = WebPSafeMalloc(1ULL, (size_t)(io->mb_w + 2 * uv_width));
        if (p->memory == NULL) {
          return 0;   // memory error.
        }
        p->tmp_y = (uint8_t*)p->memory;
        p->tmp_u = p->tmp_y + io->mb_w;
        p->tmp_v = p->tmp_u + uv_width;
        p->emit = EmitFancyRGB;
        WebPInitUpsamplers();
#endif
      }
    } else {
      p->emit = EmitYUV;
    }
    if (is_alpha) {  // need transparency output
      p->emit_alpha =
          (colorspace == MODE_RGBA_4444 || colorspace == MODE_rgbA_4444) ?
              EmitAlphaRGBA4444
          : is_rgb ? EmitAlphaRGB
          : EmitAlphaYUV;
      if (is_rgb) {
        WebPInitAlphaProcessing();
      }
    }
  }

  return 1;
}